

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O2

QSet<QWidget_*> operator-(QSet<QWidget_*> *lhs,QSet<QWidget_*> *rhs)

{
  QSet<QWidget_*> *in_RDX;
  long in_FS_OFFSET;
  Hash local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (rhs->q_hash).d;
  if ((local_20.d != (Data *)0x0) &&
     (((local_20.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_20.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QSet<QWidget_*>::subtract((QSet<QWidget_*> *)&local_20,in_RDX);
  (lhs->q_hash).d = local_20.d;
  if ((local_20.d != (Data *)0x0) &&
     (((local_20.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_20.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QWidget_*,_QHashDummyValue>::~QHash(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSet<QWidget_*>)(Hash)lhs;
  }
  __stack_chk_fail();
}

Assistant:

friend QSet operator-(const QSet &lhs, const QSet &rhs) { return QSet(lhs) -= rhs; }